

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

AttributeSpecSyntax * __thiscall slang::parsing::Parser::parseAttributeSpec(Parser *this)

{
  bool bVar1;
  ExpressionSyntax *expr;
  AttributeSpecSyntax *pAVar2;
  Token name_00;
  Token equals_00;
  Token equals;
  EqualsValueClauseSyntax *initializer;
  Token name;
  Parser *this_local;
  
  name_00 = ParserBase::expect(&this->super_ParserBase,Identifier);
  equals.info = (Info *)0x0;
  bVar1 = ParserBase::peek(&this->super_ParserBase,Equals);
  if (bVar1) {
    equals_00 = ParserBase::consume(&this->super_ParserBase);
    expr = parseExpression(this);
    equals.info = (Info *)slang::syntax::SyntaxFactory::equalsValueClause
                                    (&this->factory,equals_00,expr);
  }
  pAVar2 = slang::syntax::SyntaxFactory::attributeSpec
                     (&this->factory,name_00,(EqualsValueClauseSyntax *)equals.info);
  return pAVar2;
}

Assistant:

AttributeSpecSyntax& Parser::parseAttributeSpec() {
    auto name = expect(TokenKind::Identifier);

    EqualsValueClauseSyntax* initializer = nullptr;
    if (peek(TokenKind::Equals)) {
        auto equals = consume();
        initializer = &factory.equalsValueClause(equals, parseExpression());
    }

    return factory.attributeSpec(name, initializer);
}